

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O3

AActor * P_RoughMonsterSearch(AActor *mo,int distance,bool onlyseekable,bool frontonly)

{
  double dVar1;
  AActor *pAVar2;
  undefined7 in_register_00000009;
  undefined1 local_40;
  undefined1 local_3f;
  double local_38;
  double dStack_30;
  double local_28;
  double dStack_20;
  
  local_40 = onlyseekable;
  local_3f = frontonly;
  if ((int)CONCAT71(in_register_00000009,frontonly) != 0) {
    local_38 = (mo->__Pos).X;
    dStack_30 = (mo->__Pos).Y;
    dVar1 = FFastTrig::sin(&fasttrig,
                           (mo->Angles).Yaw.Degrees * 11930464.711111112 + 6755399441055744.0);
    dStack_20 = FFastTrig::cos(&fasttrig,
                               (mo->Angles).Yaw.Degrees * 11930464.711111112 + 6755399441055744.0);
    local_28 = -dVar1;
    dStack_20 = -dStack_20;
  }
  pAVar2 = P_BlockmapSearch(mo,distance,RoughBlockCheck,&local_40);
  return pAVar2;
}

Assistant:

AActor *P_RoughMonsterSearch(AActor *mo, int distance, bool onlyseekable, bool frontonly)
{
	BlockCheckInfo info;
	info.onlyseekable = onlyseekable;
	if ((info.frontonly = frontonly))
	{
		info.frontline.x = mo->X();
		info.frontline.y = mo->Y();
		info.frontline.dx = -mo->Angles.Yaw.Sin();
		info.frontline.dy = -mo->Angles.Yaw.Cos();
	}

	return P_BlockmapSearch(mo, distance, RoughBlockCheck, (void *)&info);
}